

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

double * marsaglia_generate(double *values,int N,double average,double deviation)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  for (lVar3 = 0; lVar3 < N + -1; lVar3 = lVar3 + 2) {
    do {
      do {
        iVar1 = rand();
        dVar7 = ((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0;
        iVar1 = rand();
        dVar8 = ((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0;
        dVar5 = dVar7 * dVar7 + dVar8 * dVar8;
      } while (1.0 <= dVar5);
    } while ((dVar5 == 0.0) && (!NAN(dVar5)));
    dVar6 = log(dVar5);
    dVar5 = (dVar6 * -2.0) / dVar5;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    values[lVar3] = dVar7 * dVar5;
    values[lVar3 + 1] = dVar8 * dVar5;
  }
  if ((N & 1U) != 0) {
    do {
      do {
        iVar1 = rand();
        dVar7 = ((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0;
        iVar1 = rand();
        dVar5 = ((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0;
        dVar5 = dVar7 * dVar7 + dVar5 * dVar5;
      } while (1.0 <= dVar5);
    } while ((dVar5 == 0.0) && (!NAN(dVar5)));
    dVar8 = log(dVar5);
    dVar5 = (dVar8 * -2.0) / dVar5;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    values[N + -1] = dVar7 * dVar5;
  }
  uVar2 = 0;
  uVar4 = (ulong)(uint)N;
  if (N < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    values[uVar2] = values[uVar2] * deviation + average;
  }
  return values;
}

Assistant:

double* marsaglia_generate(double *values, int N, double average, double  deviation)
{
	int i;
	int M;
	double x, y, rsq, f;

	M = N + N % 2;



	for (i = 0; i < N - 1; i += 2)
	{
		do {
			x = 2.0 * rand() / (double)RAND_MAX - 1.0;
			y = 2.0 * rand() / (double)RAND_MAX - 1.0;
			rsq = x * x + y * y;
		} while (rsq >= 1. || rsq == 0.);
		f = sqrt(-2.0 * log(rsq) / rsq);
		values[i] = x * f;
		values[i + 1] = y * f;
	}

	if (M != N) {
		do {
			x = 2.0 * rand() / (double)RAND_MAX - 1.0;
			y = 2.0 * rand() / (double)RAND_MAX - 1.0;
			rsq = x * x + y * y;
		} while (rsq >= 1. || rsq == 0.);
		f = sqrt(-2.0 * log(rsq) / rsq);
		values[N - 1] = x * f;
	}


	for (i = 0; i < N; ++i) {
		values[i] = (values[i] * deviation + average);
	}
	return values;
}